

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  if (0x1b < shift_amount) {
    __assert_fail("shift_amount < kBigitSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2d3,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
  }
  if (shift_amount < 0) {
    __assert_fail("shift_amount >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2d4,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
  }
  uVar2 = this->used_digits_;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
  }
  else {
    puVar1 = (this->bigits_).start_;
    lVar4 = 0;
    uVar5 = 0;
    do {
      if ((this->bigits_).length_ <= lVar4) goto LAB_0016641c;
      uVar2 = puVar1[lVar4];
      uVar3 = uVar2 >> (0x1c - (byte)shift_amount & 0x1f);
      puVar1[lVar4] = (uVar2 << ((byte)shift_amount & 0x1f)) + uVar5 & 0xfffffff;
      lVar4 = lVar4 + 1;
      uVar2 = this->used_digits_;
      uVar5 = uVar3;
    } while (lVar4 < (int)uVar2);
  }
  if (uVar3 != 0) {
    if (((int)uVar2 < 0) || ((this->bigits_).length_ <= (int)uVar2)) {
LAB_0016641c:
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xca,
                    "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                   );
    }
    (this->bigits_).start_[uVar2] = uVar3;
    this->used_digits_ = this->used_digits_ + 1;
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(int shift_amount) {
  ASSERT(shift_amount < kBigitSize);
  ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    Chunk new_carry = bigits_[i] >> (kBigitSize - shift_amount);
    bigits_[i] = ((bigits_[i] << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    bigits_[used_digits_] = carry;
    used_digits_++;
  }
}